

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processFunction
          (Wasm2JSBuilder *this,Module *m,Function *func,bool standaloneFunction)

{
  Name NVar1;
  Wasm2JSBuilder *ast;
  JsType JVar2;
  size_type sVar3;
  ulong uVar4;
  wasm *pwVar5;
  Ref *pRVar6;
  Value *pVVar7;
  Ref RVar8;
  Ref RVar9;
  Ref RVar10;
  size_t sVar11;
  size_t sVar12;
  int __fdout;
  char *pcVar13;
  char *extraout_RDX;
  char *extraout_RDX_00;
  Type TVar14;
  uint uVar15;
  Ref in_R8;
  size_t in_R9;
  bool bVar16;
  IString name_00;
  IString name_01;
  IString name_02;
  IString IVar17;
  IString arg;
  IString op;
  IString name_03;
  uint in_stack_fffffffffffffb68;
  Ref local_3f8;
  char *local_3f0;
  uint local_3dc;
  Index i_1;
  size_t theVarIndex;
  Ref theVar;
  JsType jsType;
  Ref local_320;
  IString name;
  Index i;
  bool needCoercions;
  ValueBuilder *local_2f8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  allocator<char> local_2b1;
  string local_2b0 [40];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  allocator<char> local_259;
  string local_258 [40];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  allocator<char> local_201;
  string local_200 [40];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  allocator<char> local_1a9;
  string local_1a8 [40];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  allocator<char> local_141;
  string local_140 [32];
  undefined1 local_120 [8];
  PassRunner runner;
  bool standaloneFunction_local;
  Function *func_local;
  Module *m_local;
  Wasm2JSBuilder *this_local;
  Ref ret;
  
  if (standaloneFunction) {
    PassRunner::PassRunner((PassRunner *)local_120,m);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_140,"flatten",&local_141);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ::wasm::PassRunner::add(local_120,local_140,&local_180);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_180);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1a8,"simplify-locals-notee-nostructure",&local_1a9);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ::wasm::PassRunner::add(local_120,local_1a8,&local_1d8);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_1d8);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_200,"reorder-locals",&local_201);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ::wasm::PassRunner::add(local_120,local_200,&local_230);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_230);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_258,"remove-unused-names",&local_259);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ::wasm::PassRunner::add(local_120,local_258,&local_288);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_288);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator(&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2b0,"vacuum",&local_2b1);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ::wasm::PassRunner::add(local_120,local_2b0,&local_2e0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_2e0);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    ::wasm::PassRunner::runOnFunction((Function *)local_120);
    PassRunner::~PassRunner((PassRunner *)local_120);
  }
  std::
  unordered_map<wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>_>
  ::clear(&this->frees);
  std::
  unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  ::clear(&this->temps);
  Names::ensureNames(func);
  IVar17 = fromName(this,(func->super_Importable).super_Named.name.super_IString.str,Top);
  name_00.str._M_str = IVar17.str._M_str;
  local_2f8 = (ValueBuilder *)IVar17.str._M_len;
  name_00.str._M_len = (size_t)name_00.str._M_str;
  this_local = (Wasm2JSBuilder *)cashew::ValueBuilder::makeFunction(local_2f8,name_00);
  bVar16 = true;
  if (((this->options).optimizeLevel != 0) && (bVar16 = true, !standaloneFunction)) {
    sVar3 = std::
            unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            ::count(&this->functionsCallableFromOutside,(key_type *)func);
    bVar16 = sVar3 != 0;
  }
  name.str._M_str._0_4_ = 0;
  while( true ) {
    uVar4 = ::wasm::Function::getNumParams();
    uVar15 = (uint)func;
    if (uVar4 <= (uint)name.str._M_str) break;
    NVar1.super_IString.str = (IString)::wasm::Function::getLocalNameOrGeneric(uVar15);
    pcVar13 = (char *)0x2;
    IVar17 = fromName(this,NVar1,Local);
    local_320.inst = (Value *)IVar17.str._M_len;
    name.str._M_len = (size_t)IVar17.str._M_str;
    arg.str._M_str = pcVar13;
    arg.str._M_len = name.str._M_len;
    cashew::ValueBuilder::appendArgumentToFunction((ValueBuilder *)this_local,local_320,arg);
    if (bVar16) {
      TVar14.id = (uintptr_t)(uint)name.str._M_str;
      pwVar5 = (wasm *)::wasm::Function::getLocalType(uVar15);
      JVar2 = ::wasm::wasmToJsType(pwVar5,TVar14);
      uVar4 = needsJsCoercion(JVar2);
      if ((uVar4 & 1) != 0) {
        pRVar6 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
        pVVar7 = cashew::Ref::operator->(pRVar6);
        name_01.str._M_str = extraout_RDX;
        name_01.str._M_len = name.str._M_len;
        RVar8 = cashew::ValueBuilder::makeName((ValueBuilder *)local_320.inst,name_01);
        sVar11 = BLOCK;
        RVar10.inst = cashew::SET.inst;
        theVar.inst = (Value *)local_320;
        name_02.str._M_str = extraout_RDX_00;
        name_02.str._M_len = name.str._M_len;
        RVar9 = cashew::ValueBuilder::makeName((ValueBuilder *)local_320.inst,name_02);
        pcVar13 = (char *)makeJsCoercion(RVar9,JVar2);
        op.str._M_str = pcVar13;
        op.str._M_len = sVar11;
        RVar10 = cashew::ValueBuilder::makeBinary(RVar8.inst,RVar10,op,in_R8);
        RVar10 = cashew::ValueBuilder::makeStatement(RVar10);
        cashew::Value::push_back(pVVar7,RVar10);
      }
    }
    name.str._M_str._0_4_ = (uint)name.str._M_str + 1;
  }
  theVarIndex = (size_t)cashew::ValueBuilder::makeVar(false);
  pRVar6 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
  pVVar7 = cashew::Ref::operator->(pRVar6);
  sVar11 = cashew::Value::size(pVVar7);
  pRVar6 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
  pVVar7 = cashew::Ref::operator->(pRVar6);
  cashew::Value::push_back(pVVar7,(Ref)theVarIndex);
  ast = this_local;
  RVar8.inst = (Value *)(ulong)standaloneFunction;
  RVar10 = processExpression(this,func->body,m,func,standaloneFunction);
  flattenAppend((Ref)ast,RVar10);
  for (local_3dc = ::wasm::Function::getVarIndexBase(); uVar4 = ::wasm::Function::getNumLocals(),
      sVar12 = theVarIndex, local_3dc < uVar4; local_3dc = local_3dc + 1) {
    NVar1.super_IString.str = (IString)::wasm::Function::getLocalNameOrGeneric(uVar15);
    IVar17 = fromName(this,NVar1,Local);
    TVar14.id = (uintptr_t)local_3dc;
    pwVar5 = (wasm *)::wasm::Function::getLocalType(uVar15);
    JVar2 = ::wasm::wasmToJsType(pwVar5,TVar14);
    pcVar13 = (char *)makeJsCoercedZero(JVar2);
    local_3f8.inst = (Value *)IVar17.str._M_len;
    local_3f0 = IVar17.str._M_str;
    name_03.str._M_str = pcVar13;
    name_03.str._M_len = (size_t)local_3f0;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)sVar12,local_3f8,name_03,RVar8);
  }
  pRVar6 = (Ref *)cashew::Ref::operator[]((uint)&theVarIndex);
  __fdout = (int)uVar4;
  pVVar7 = cashew::Ref::operator->(pRVar6);
  sVar12 = cashew::Value::size(pVVar7);
  if (sVar12 == 0) {
    pRVar6 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
    pVVar7 = cashew::Ref::operator->(pRVar6);
    cashew::Value::splice
              (pVVar7,(int)sVar11,(__off64_t *)0x1,__fdout,(__off64_t *)RVar8.inst,in_R9,
               in_stack_fffffffffffffb68);
  }
  return (Ref)(Value *)this_local;
}

Assistant:

Ref Wasm2JSBuilder::processFunction(Module* m,
                                    Function* func,
                                    bool standaloneFunction) {
  if (standaloneFunction) {
    // We are only printing a function, not a whole module. Prepare it for
    // translation now (if there were a module, we'd have done this for all
    // functions in parallel, earlier).
    PassRunner runner(m);
    // We only run a subset of all passes here. TODO: create a full valid module
    // for each assertion body.
    runner.add("flatten");
    runner.add("simplify-locals-notee-nostructure");
    runner.add("reorder-locals");
    runner.add("remove-unused-names");
    runner.add("vacuum");
    runner.runOnFunction(func);
  }

  // We process multiple functions from a single Wasm2JSBuilder instance, so
  // clean up the function-specific local state before each function.
  frees.clear();
  temps.clear();

  // We will be symbolically referring to all variables in the function, so make
  // sure that everything has a name and it's unique.
  Names::ensureNames(func);
  Ref ret = ValueBuilder::makeFunction(fromName(func->name, NameScope::Top));
  // arguments
  bool needCoercions = options.optimizeLevel == 0 || standaloneFunction ||
                       functionsCallableFromOutside.count(func->name);
  for (Index i = 0; i < func->getNumParams(); i++) {
    IString name = fromName(func->getLocalNameOrGeneric(i), NameScope::Local);
    ValueBuilder::appendArgumentToFunction(ret, name);
    if (needCoercions) {
      auto jsType = wasmToJsType(func->getLocalType(i));
      if (needsJsCoercion(jsType)) {
        ret[3]->push_back(ValueBuilder::makeStatement(ValueBuilder::makeBinary(
          ValueBuilder::makeName(name),
          SET,
          makeJsCoercion(ValueBuilder::makeName(name), jsType))));
      }
    }
  }
  Ref theVar = ValueBuilder::makeVar();
  size_t theVarIndex = ret[3]->size();
  ret[3]->push_back(theVar);
  // body
  flattenAppend(ret,
                processExpression(func->body, m, func, standaloneFunction));
  // vars, including new temp vars
  for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
    ValueBuilder::appendToVar(
      theVar,
      fromName(func->getLocalNameOrGeneric(i), NameScope::Local),
      makeJsCoercedZero(wasmToJsType(func->getLocalType(i))));
  }
  if (theVar[1]->size() == 0) {
    ret[3]->splice(theVarIndex, 1);
  }
  return ret;
}